

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O3

double __thiscall fasttext::Meter::log(Meter *this,double __x)

{
  uint64_t *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  mapped_type *pmVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  ulong *in_RDX;
  const_iterator __end1;
  ulong *in_RSI;
  key_type *pkVar6;
  const_iterator __begin1;
  ulong uVar7;
  int *label;
  key_type *__k;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  this->nexamples_ = this->nexamples_ + 1;
  pkVar6 = (key_type *)in_RSI[1];
  uVar2 = in_RDX[1];
  __k = (key_type *)*in_RSI;
  uVar7 = *in_RDX;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = pkVar6;
  auVar3 = vpunpcklqdq_avx(auVar11,auVar8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar7;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = __k;
  auVar8 = vpunpcklqdq_avx(auVar13,auVar12);
  auVar3 = vpsubq_avx(auVar3,auVar8);
  auVar8 = vpsravq_avx512vl(auVar3,_DAT_00134b80);
  auVar3._0_8_ = (this->metrics_).gold;
  auVar3._8_8_ = (this->metrics_).predicted;
  auVar3 = vpaddq_avx(auVar8,auVar3);
  auVar10 = ZEXT1664(auVar3);
  (this->metrics_).gold = auVar3._0_8_;
  (this->metrics_).predicted = auVar3._8_8_;
  if (uVar7 != uVar2) {
    do {
      pkVar6 = (key_type *)(uVar7 + 4);
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->labelMetrics_,pkVar6);
      pmVar4->predicted = pmVar4->predicted + 1;
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (*in_RSI,in_RSI[1],pkVar6);
      if (_Var5._M_current != (int *)in_RSI[1]) {
        pmVar4 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->labelMetrics_,pkVar6);
        pmVar4->predictedGold = pmVar4->predictedGold + 1;
        puVar1 = &(this->metrics_).predictedGold;
        *puVar1 = *puVar1 + 1;
      }
      uVar7 = uVar7 + 8;
    } while (uVar7 != uVar2);
    __k = (key_type *)*in_RSI;
    pkVar6 = (key_type *)in_RSI[1];
  }
  dVar9 = auVar10._0_8_;
  if (__k != pkVar6) {
    do {
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->labelMetrics_,__k);
      dVar9 = auVar10._0_8_;
      pmVar4->gold = pmVar4->gold + 1;
      __k = __k + 1;
    } while (__k != pkVar6);
  }
  return dVar9;
}

Assistant:

void Meter::log(
    const std::vector<int32_t>& labels,
    const Predictions& predictions) {
  nexamples_++;
  metrics_.gold += labels.size();
  metrics_.predicted += predictions.size();

  for (const auto& prediction : predictions) {
    labelMetrics_[prediction.second].predicted++;

    if (utils::contains(labels, prediction.second)) {
      labelMetrics_[prediction.second].predictedGold++;
      metrics_.predictedGold++;
    }
  }

  for (const auto& label : labels) {
    labelMetrics_[label].gold++;
  }
}